

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::generate_service(t_json_generator *this,t_service *tservice)

{
  _Base_ptr p_Var1;
  pointer pptVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  start_object(this,true);
  std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&functions);
  get_qualified_name_abi_cxx11_(&local_b0,this,&tservice->super_t_type);
  write_key_and_string(this,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  if (tservice->extends_ != (t_service *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,"extends",(allocator *)&functions);
    get_qualified_name_abi_cxx11_(&local_f0,this,&tservice->extends_->super_t_type);
    write_key_and_string(this,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((tservice->super_t_type).super_t_doc.has_doc_ == true) {
    std::__cxx11::string::string((string *)&local_110,"doc",(allocator *)&functions);
    std::__cxx11::string::string
              ((string *)&local_130,(string *)&(tservice->super_t_type).super_t_doc.doc_);
    write_key_and_string(this,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_150,"annotations",(allocator *)&functions);
    write_key_and(this,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    start_object(this,true);
    for (p_Var1 = (tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_header
                  ._M_left;
        (_Rb_tree_header *)p_Var1 !=
        &(tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var1 + 1));
      std::__cxx11::string::string((string *)&local_70,(string *)(p_Var1 + 2));
      write_key_and_string(this,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    end_object(this);
  }
  std::__cxx11::string::string((string *)&local_170,"functions",(allocator *)&functions);
  write_key_and(this,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  start_array(this);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar2 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar2 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    write_comma_if_needed(this);
    generate_function(this,*pptVar2);
    indicate_comma_needed(this);
  }
  end_array(this);
  end_object(this);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_json_generator::generate_service(t_service* tservice) {
  start_object();

  write_key_and_string("name", get_qualified_name(tservice));

  if (tservice->get_extends()) {
    write_key_and_string("extends", get_qualified_name(tservice->get_extends()));
  }

  if (tservice->has_doc()) {
    write_key_and_string("doc", tservice->get_doc());
  }

  if (tservice->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : tservice->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  write_key_and("functions");
  start_array();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    write_comma_if_needed();
    generate_function(*fn_iter);
    indicate_comma_needed();
  }
  end_array();

  end_object();
}